

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::CommonArgProperties<Catch::ConfigData>::CommonArgProperties
          (CommonArgProperties<Catch::ConfigData> *this)

{
  (this->boundField).functionObj = (IArgFunction<Catch::ConfigData> *)0x0;
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  (this->detail)._M_dataplus._M_p = (pointer)&(this->detail).field_2;
  (this->detail)._M_string_length = 0;
  (this->detail).field_2._M_local_buf[0] = '\0';
  (this->placeholder)._M_dataplus._M_p = (pointer)&(this->placeholder).field_2;
  (this->placeholder)._M_string_length = 0;
  (this->placeholder).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BoundArgFunction() : functionObj( CLARA_NULL ) {}